

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

idx_t duckdb::CAPIAggregateStateSize(AggregateFunction *function)

{
  idx_t iVar1;
  InvalidInputException *this;
  CAggregateExecuteInfo exec_info;
  
  exec_info.info =
       (CAggregateFunctionInfo *)
       shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->(&function->function_info);
  exec_info.success = true;
  exec_info.error._M_dataplus._M_p = (pointer)&exec_info.error.field_2;
  exec_info.error._M_string_length = 0;
  exec_info.error.field_2._M_local_buf[0] = '\0';
  iVar1 = (*(exec_info.info)->state_size)((duckdb_function_info)&exec_info);
  if (exec_info.success != false) {
    ::std::__cxx11::string::~string((string *)&exec_info.error);
    return iVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,&exec_info.error);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t CAPIAggregateStateSize(const AggregateFunction &function) {
	auto &function_info = function.function_info->Cast<duckdb::CAggregateFunctionInfo>();
	CAggregateExecuteInfo exec_info(function_info);
	auto c_function_info = reinterpret_cast<duckdb_function_info>(&exec_info);
	auto result = function_info.state_size(c_function_info);
	if (!exec_info.success) {
		throw InvalidInputException(exec_info.error);
	}
	return result;
}